

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

uint sf::priv::RenderTextureImplFBO::getMaximumAntialiasingLevel(void)

{
  uint uVar1;
  TransientContextLock *unaff_retaddr;
  GLint samples;
  TransientContextLock lock;
  TransientContextLock *in_stack_fffffffffffffff0;
  uint local_8 [2];
  
  GlResource::TransientContextLock::TransientContextLock(unaff_retaddr);
  local_8[0] = 0;
  (*sf_glad_glGetIntegerv)(0x8d57,(GLint *)local_8);
  uVar1 = local_8[0];
  GlResource::TransientContextLock::~TransientContextLock(in_stack_fffffffffffffff0);
  return uVar1;
}

Assistant:

unsigned int RenderTextureImplFBO::getMaximumAntialiasingLevel()
{
    TransientContextLock lock;

    GLint samples = 0;

#ifndef SFML_OPENGL_ES

    glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

#endif

    return static_cast<unsigned int>(samples);
}